

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txrequest_tests.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1acccd7::Scenario::Check
          (Scenario *this,NodeId peer,vector<GenTxid,_std::allocator<GenTxid>_> *expected,
          size_t candidates,size_t inflight,size_t completed,string *checkname,microseconds offset)

{
  pointer *pppVar1;
  vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
  *this_00;
  pointer pcVar2;
  size_type *psVar3;
  Runner *pRVar4;
  pointer __a;
  pointer ppVar5;
  pointer ppVar6;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar7;
  size_type __n;
  pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_> *ppVar8;
  long lVar9;
  pointer ppVar10;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar11;
  long in_FS_OFFSET;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> comment;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c8;
  size_t local_a8;
  size_t local_a0;
  size_t local_98;
  long *local_90 [2];
  long local_80 [2];
  vector<GenTxid,_std::allocator<GenTxid>_> local_70;
  size_type *local_58;
  size_type local_50;
  size_type local_48;
  undefined8 uStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_c8._M_dataplus._M_p = (pointer)&local_c8.field_2;
  pcVar2 = (this->m_testname)._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_c8,pcVar2,pcVar2 + (this->m_testname)._M_string_length);
  std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
            (&local_c8," ");
  pbVar7 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
           _M_append(&local_c8,(checkname->_M_dataplus)._M_p,checkname->_M_string_length);
  local_58 = &local_48;
  psVar3 = (size_type *)(pbVar7->_M_dataplus)._M_p;
  paVar11 = &pbVar7->field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar3 == paVar11) {
    local_48 = paVar11->_M_allocated_capacity;
    uStack_40 = *(undefined8 *)((long)&pbVar7->field_2 + 8);
  }
  else {
    local_48 = paVar11->_M_allocated_capacity;
    local_58 = psVar3;
  }
  local_50 = pbVar7->_M_string_length;
  (pbVar7->_M_dataplus)._M_p = (pointer)paVar11;
  pbVar7->_M_string_length = 0;
  (pbVar7->field_2)._M_local_buf[0] = '\0';
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_c8._M_dataplus._M_p != &local_c8.field_2) {
    operator_delete(local_c8._M_dataplus._M_p,local_c8.field_2._M_allocated_capacity + 1);
  }
  if (offset.__r < 1) {
    pRVar4 = this->m_runner;
    local_c8.field_2._M_allocated_capacity = (this->m_now).__r;
    local_c8.field_2._8_8_ = offset.__r;
    local_90[0] = local_80;
    local_c8._M_dataplus._M_p = (pointer)pRVar4;
    local_c8._M_string_length = peer;
    local_a8 = candidates;
    local_a0 = inflight;
    local_98 = completed;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_90,local_58,(pointer)(local_50 + (long)local_58));
    _GLOBAL__N_1::std::vector<GenTxid,_std::allocator<GenTxid>_>::vector(&local_70,expected);
    __a = (pRVar4->actions).
          super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish;
    if (__a == (pRVar4->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      this_00 = &pRVar4->actions;
      __n = _GLOBAL__N_1::std::
            vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
            ::_M_check_len(this_00,1,"vector::_M_realloc_insert");
      ppVar5 = (pRVar4->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
      ppVar6 = (pRVar4->actions).
               super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (__n == 0) {
        ppVar8 = (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                  *)0x0;
      }
      else {
        ppVar8 = __gnu_cxx::
                 new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                 ::allocate((new_allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>
                             *)this_00,__n,(void *)0x0);
      }
      lVar9 = (long)__a - (long)ppVar5 >> 3;
      std::
      allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
      ::
      construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::Check(long,std::vector<GenTxid,std::allocator<GenTxid>>const&,unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
                ((allocator_type *)(&ppVar8->first + lVar9),
                 (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                  *)&this->m_now,(duration<long,_std::ratio<1L,_1000000L>_> *)&local_c8,
                 (anon_class_112_9_1179051b *)(lVar9 * -0x3333333333333333));
      ppVar10 = _GLOBAL__N_1::std::
                vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ::_S_do_relocate(ppVar5,__a,ppVar8,this_00);
      ppVar10 = _GLOBAL__N_1::std::
                vector<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                ::_S_do_relocate(__a,ppVar6,ppVar10 + 1,this_00);
      if (ppVar5 != (pointer)0x0) {
        operator_delete(ppVar5,(long)(pRVar4->actions).
                                     super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                                     ._M_impl.super__Vector_impl_data._M_end_of_storage -
                               (long)ppVar5);
      }
      (pRVar4->actions).
      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start = ppVar8;
      (pRVar4->actions).
      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = ppVar10;
      (pRVar4->actions).
      super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = ppVar8 + __n;
    }
    else {
      std::
      allocator_traits<std::allocator<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>>>
      ::
      construct<std::pair<std::chrono::duration<long,std::ratio<1l,1000000l>>,std::function<void()>>,std::chrono::duration<long,std::ratio<1l,1000000l>>&,(anonymous_namespace)::Scenario::Check(long,std::vector<GenTxid,std::allocator<GenTxid>>const&,unsigned_long,unsigned_long,unsigned_long,std::__cxx11::string_const&,std::chrono::duration<long,std::ratio<1l,1000000l>>)::_lambda()_1_>
                ((allocator_type *)__a,
                 (pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>
                  *)&this->m_now,(duration<long,_std::ratio<1L,_1000000L>_> *)&local_c8,
                 (anon_class_112_9_1179051b *)peer);
      pppVar1 = &(pRVar4->actions).
                 super__Vector_base<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>,_std::allocator<std::pair<std::chrono::duration<long,_std::ratio<1L,_1000000L>_>,_std::function<void_()>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
      *pppVar1 = *pppVar1 + 1;
    }
    if (local_70.super__Vector_base<GenTxid,_std::allocator<GenTxid>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_70.super__Vector_base<GenTxid,_std::allocator<GenTxid>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_70.super__Vector_base<GenTxid,_std::allocator<GenTxid>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_70.super__Vector_base<GenTxid,_std::allocator<GenTxid>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_90[0] != local_80) {
      operator_delete(local_90[0],local_80[0] + 1);
    }
    if (local_58 != &local_48) {
      operator_delete(local_58,local_48 + 1);
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      return;
    }
    __stack_chk_fail();
  }
  __assert_fail("offset.count() <= 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/brunoerg[P]bitcoin/src/test/txrequest_tests.cpp"
                ,0xaa,
                "void (anonymous namespace)::Scenario::Check(NodeId, const std::vector<GenTxid> &, size_t, size_t, size_t, const std::string &, std::chrono::microseconds)"
               );
}

Assistant:

void Check(NodeId peer, const std::vector<GenTxid>& expected, size_t candidates, size_t inflight,
        size_t completed, const std::string& checkname,
        std::chrono::microseconds offset = std::chrono::microseconds{0})
    {
        const auto comment = m_testname + " " + checkname;
        auto& runner = m_runner;
        const auto now = m_now;
        assert(offset.count() <= 0);
        runner.actions.emplace_back(m_now, [=,&runner]() {
            std::vector<std::pair<NodeId, GenTxid>> expired_now;
            auto ret = runner.txrequest.GetRequestable(peer, now + offset, &expired_now);
            for (const auto& entry : expired_now) runner.expired.insert(entry);
            runner.txrequest.SanityCheck();
            runner.txrequest.PostGetRequestableSanityCheck(now + offset);
            size_t total = candidates + inflight + completed;
            size_t real_total = runner.txrequest.Count(peer);
            size_t real_candidates = runner.txrequest.CountCandidates(peer);
            size_t real_inflight = runner.txrequest.CountInFlight(peer);
            BOOST_CHECK_MESSAGE(real_total == total, strprintf("[" + comment + "] total %i (%i expected)", real_total, total));
            BOOST_CHECK_MESSAGE(real_inflight == inflight, strprintf("[" + comment + "] inflight %i (%i expected)", real_inflight, inflight));
            BOOST_CHECK_MESSAGE(real_candidates == candidates, strprintf("[" + comment + "] candidates %i (%i expected)", real_candidates, candidates));
            BOOST_CHECK_MESSAGE(ret == expected, "[" + comment + "] mismatching requestables");
        });
    }